

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to1.h
# Opt level: O0

void ncnn::convolution_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [24];
  float *pfVar7;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar8;
  undefined1 auVar9 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_3;
  Mat *m_1;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  undefined4 in_stack_fffffffffffff798;
  float in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  float fVar10;
  undefined4 in_stack_fffffffffffff7a4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff7a8;
  int local_72c;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined4 local_708;
  long local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined8 local_6e0;
  int local_6d4;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined4 local_6b8;
  long local_6b0;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined8 local_690;
  undefined8 *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_644;
  int local_640;
  int local_63c;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined4 local_620;
  long local_618;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined8 local_5f8;
  long local_5f0;
  int local_5e4;
  long local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  reference local_5c0;
  vector<int,_std::allocator<int>_> local_5a0;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  long *local_568;
  long *local_560;
  long *local_558;
  long *local_550;
  undefined8 *local_548;
  undefined8 *local_538;
  undefined8 *local_528;
  undefined8 *local_500;
  undefined8 *local_4e0;
  undefined8 *local_4c0;
  undefined1 local_4b5;
  int local_4b4;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_480;
  long *local_478;
  int local_46c;
  undefined8 *local_468;
  float local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  long *local_438;
  int local_430;
  float local_42c [3];
  long *local_420;
  undefined8 local_418;
  long *local_410;
  undefined8 local_408;
  long *local_400;
  undefined8 local_3f8;
  long *local_3f0;
  undefined8 local_3e8;
  long *local_3e0;
  undefined1 local_3d5;
  int local_3d4;
  undefined8 *local_3c8;
  undefined1 local_3a5;
  int local_3a4;
  undefined8 *local_398;
  undefined8 *local_330;
  undefined1 (*local_328) [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  ulong local_210;
  undefined8 uStack_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  undefined1 local_130 [16];
  ulong local_120;
  undefined8 uStack_118;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined8 *local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  long local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  undefined8 *local_a0;
  long local_98;
  undefined4 local_8c;
  long local_88;
  long local_80;
  undefined4 local_74;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_574 = *(int *)((long)in_RDI + 0x2c);
  local_578 = (int)in_RDI[7];
  local_57c = *(int *)((long)in_RSI + 0x2c);
  local_580 = (int)in_RSI[6];
  local_584 = (int)in_RSI[7];
  local_588 = in_R8D * in_R9D;
  local_570 = in_R9D;
  local_56c = in_R8D;
  local_568 = in_RCX;
  local_560 = in_RDX;
  local_558 = in_RSI;
  local_550 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x82fbbd);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff7a8,CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  std::allocator<int>::~allocator((allocator<int> *)0x82fbe9);
  local_5c0 = std::vector<int,_std::allocator<int>_>::operator[](&local_5a0,0);
  local_5c4 = 0;
  local_5c8 = 0;
  local_5cc = local_574 * dilation_w - local_56c * in_stack_00000008;
  for (local_5d0 = 0; local_5d0 < local_570; local_5d0 = local_5d0 + 1) {
    for (local_5d4 = 0; local_5d4 < local_56c; local_5d4 = local_5d4 + 1) {
      local_5c0[local_5c4] = local_5c8;
      local_5c4 = local_5c4 + 1;
      local_5c8 = in_stack_00000008 + local_5c8;
    }
    local_5c8 = local_5cc + local_5c8;
  }
  local_478 = local_568;
  local_5e0 = *local_568;
  for (local_5e4 = 0; local_5e4 < local_584; local_5e4 = local_5e4 + 1) {
    local_4a8 = &local_638;
    local_6c = *(int *)((long)local_558 + 0x2c);
    local_70 = (int)local_558[6];
    local_74 = *(undefined4 *)((long)local_558 + 0x34);
    local_5f0 = *local_558 + local_558[8] * (long)local_5e4 * local_558[2];
    local_88 = local_558[2];
    local_8c = (undefined4)local_558[3];
    local_98 = local_558[4];
    local_68 = &local_638;
    local_58 = (long)local_6c * (long)local_70 * local_88;
    local_488 = &local_638;
    local_548 = &local_638;
    local_5c = 0x10;
    local_4b4 = local_5e4;
    local_4b5 = 1;
    local_638 = 0;
    local_628 = 0;
    local_620 = 0;
    local_610 = 0;
    local_60c = 0;
    local_608 = 0;
    local_604 = 0;
    local_600 = 0;
    local_5f8 = 0;
    local_630 = 0;
    local_4c0 = local_548;
    local_80 = local_5f0;
    local_618 = local_98;
    for (local_63c = 0; local_63c < local_580; local_63c = local_63c + 1) {
      for (local_640 = 0; local_640 < local_57c; local_640 = local_640 + 1) {
        local_644 = 0.0;
        if (local_5e0 != 0) {
          local_644 = *(float *)(local_5e0 + (long)local_5e4 * 4);
        }
        local_398 = &local_6d0;
        local_dc = *(int *)((long)local_560 + 0x2c);
        local_e0 = (int)local_560[6];
        local_e4 = *(undefined4 *)((long)local_560 + 0x34);
        local_f0 = (undefined8 *)(*local_560 + local_560[8] * (long)local_5e4 * local_560[2]);
        local_f8 = local_560[2];
        local_fc = (undefined4)local_560[3];
        local_108 = local_560[4];
        local_d8 = &local_6d0;
        local_38 = (long)local_dc * (long)local_e0 * local_f8;
        local_480 = &local_6d0;
        local_538 = &local_6d0;
        local_3c = 0x10;
        uStack_228 = 0;
        uStack_230 = 0;
        uStack_238 = 0;
        local_240 = 0;
        local_3a4 = local_5e4;
        local_3a5 = 1;
        uStack_668 = 0;
        uStack_670 = 0;
        uStack_678 = 0;
        local_680 = 0;
        local_6d0 = 0;
        local_6c0 = 0;
        local_6b8 = 0;
        local_6a8 = 0;
        local_6a4 = 0;
        local_6a0 = 0;
        local_69c = 0;
        local_698 = 0;
        local_690 = 0;
        local_6c8 = 0;
        local_688 = local_f0;
        for (local_6d4 = 0; local_6d4 < local_578; local_6d4 = local_6d4 + 1) {
          local_3c8 = &local_720;
          local_a4 = *(int *)((long)local_550 + 0x2c);
          local_a8 = (int)local_550[6];
          local_ac = *(undefined4 *)((long)local_550 + 0x34);
          local_b8 = *local_550 + local_550[8] * (long)local_6d4 * local_550[2];
          local_c0 = local_550[2];
          local_c4 = (undefined4)local_550[3];
          local_d0 = local_550[4];
          local_a0 = &local_720;
          local_48 = (long)local_a4 * (long)local_a8 * local_c0;
          local_46c = local_63c * stride_w;
          local_468 = &local_720;
          for (local_72c = 0; local_72c < local_588; local_72c = local_72c + 1) {
            local_328 = (undefined1 (*) [32])
                        (local_b8 + (long)local_a4 * (long)local_46c * local_c0 +
                         (long)(local_640 * dilation_h * 8) * 4 +
                        (long)(local_5c0[local_72c] << 3) * 4);
            auVar6 = *(undefined1 (*) [24])*local_328;
            local_330 = local_688;
            local_300 = *local_688;
            uStack_2f8 = local_688[1];
            uStack_2f0 = local_688[2];
            uStack_2e8 = local_688[3];
            local_320 = local_680;
            uStack_318 = uStack_678;
            uStack_310 = uStack_670;
            uStack_308 = uStack_668;
            local_2e0._0_4_ = auVar6._0_4_;
            local_260 = (float)local_2e0._0_4_;
            local_2e0._4_4_ = auVar6._4_4_;
            fStack_25c = (float)local_2e0._4_4_;
            fStack_2d8 = auVar6._8_4_;
            fStack_258 = fStack_2d8;
            fStack_2d4 = auVar6._12_4_;
            fStack_254 = fStack_2d4;
            fStack_2d0 = auVar6._16_4_;
            fStack_250 = fStack_2d0;
            fStack_2cc = auVar6._20_4_;
            fStack_24c = fStack_2cc;
            fStack_2c8 = (float)*(undefined8 *)(*local_328 + 0x18);
            fStack_248 = fStack_2c8;
            fStack_2c4 = (float)((ulong)*(undefined8 *)(*local_328 + 0x18) >> 0x20);
            fStack_244 = fStack_2c4;
            local_280._0_4_ = (float)local_300;
            local_280._4_4_ = (float)((ulong)local_300 >> 0x20);
            uStack_278._0_4_ = (float)uStack_2f8;
            uStack_278._4_4_ = (float)((ulong)uStack_2f8 >> 0x20);
            uStack_270._0_4_ = (float)uStack_2f0;
            uStack_270._4_4_ = (float)((ulong)uStack_2f0 >> 0x20);
            uStack_268._0_4_ = (float)uStack_2e8;
            local_2a0._4_4_ = (float)local_2e0._4_4_ * local_280._4_4_;
            local_2a0._0_4_ = (float)local_2e0._0_4_ * (float)local_280;
            local_2a0._8_4_ = fStack_2d8 * (float)uStack_278;
            local_2a0._12_4_ = fStack_2d4 * uStack_278._4_4_;
            local_2a0._16_4_ = fStack_2d0 * (float)uStack_270;
            local_2a0._20_4_ = fStack_2cc * uStack_270._4_4_;
            local_2a0._24_4_ = fStack_2c8 * (float)uStack_268;
            local_2a0._28_4_ = fStack_2c4;
            uVar1 = local_680;
            uVar2 = uStack_678;
            uVar3 = uStack_670;
            uVar4 = uStack_668;
            local_2c0._0_4_ = (float)local_680;
            local_2c0._4_4_ = (float)((ulong)local_680 >> 0x20);
            uStack_2b8._0_4_ = (float)uStack_678;
            uStack_2b8._4_4_ = (float)((ulong)uStack_678 >> 0x20);
            uStack_2b0._0_4_ = (float)uStack_670;
            uStack_2b0._4_4_ = (float)((ulong)uStack_670 >> 0x20);
            uStack_2a8._0_4_ = (float)uStack_668;
            uStack_2a8._4_4_ = (float)((ulong)uStack_668 >> 0x20);
            local_680 = CONCAT44((float)local_2e0._4_4_ * local_280._4_4_ + local_2c0._4_4_,
                                 (float)local_2e0._0_4_ * (float)local_280 + (float)local_2c0);
            uStack_678 = CONCAT44(fStack_2d4 * uStack_278._4_4_ + uStack_2b8._4_4_,
                                  fStack_2d8 * (float)uStack_278 + (float)uStack_2b8);
            uStack_670 = CONCAT44(fStack_2cc * uStack_270._4_4_ + uStack_2b0._4_4_,
                                  fStack_2d0 * (float)uStack_270 + (float)uStack_2b0);
            uStack_668 = CONCAT44(fStack_2c4 + uStack_2a8._4_4_,
                                  fStack_2c8 * (float)uStack_268 + (float)uStack_2a8);
            local_688 = local_688 + 4;
            _local_2e0 = *local_328;
            local_2c0 = uVar1;
            uStack_2b8 = uVar2;
            uStack_2b0 = uVar3;
            uStack_2a8 = uVar4;
            local_280 = local_300;
            uStack_278 = uStack_2f8;
            uStack_270 = uStack_2f0;
            uStack_268 = uStack_2e8;
          }
          local_528 = &local_720;
          local_4c = 0x10;
          local_3d4 = local_6d4;
          local_3d5 = 1;
          local_720 = 0;
          local_710 = 0;
          local_708 = 0;
          local_6f8 = 0;
          local_6f4 = 0;
          local_6f0 = 0;
          local_6ec = 0;
          local_6e8 = 0;
          local_6e0 = 0;
          local_718 = 0;
          local_500 = local_528;
          local_700 = local_d0;
        }
        local_1e0 = local_680;
        uStack_1d8 = uStack_678;
        uStack_1d0 = uStack_670;
        uStack_1c8 = uStack_668;
        local_160 = local_680;
        uStack_158 = uStack_678;
        uStack_150 = uStack_670;
        uStack_148 = uStack_668;
        local_170 = uStack_670;
        uVar3 = local_170;
        uStack_168 = uStack_668;
        uVar4 = uStack_168;
        local_180 = local_680;
        uVar1 = local_180;
        uStack_178 = uStack_678;
        uVar2 = uStack_178;
        local_170._0_4_ = (float)uStack_670;
        local_170._4_4_ = (float)((ulong)uStack_670 >> 0x20);
        uStack_168._0_4_ = (float)uStack_668;
        uStack_168._4_4_ = (float)((ulong)uStack_668 >> 0x20);
        local_180._0_4_ = (float)local_680;
        local_180._4_4_ = (float)((ulong)local_680 >> 0x20);
        uStack_178._0_4_ = (float)uStack_678;
        uStack_178._4_4_ = (float)((ulong)uStack_678 >> 0x20);
        local_1f0 = (float)local_170 + (float)local_180;
        fStack_1ec = local_170._4_4_ + local_180._4_4_;
        fStack_1e8 = (float)uStack_168 + (float)uStack_178;
        fStack_1e4 = uStack_168._4_4_ + uStack_178._4_4_;
        local_1c0 = CONCAT44(fStack_1ec,local_1f0);
        uStack_1b8 = CONCAT44(fStack_1e4,fStack_1e8);
        auVar5._8_8_ = uStack_1b8;
        auVar5._0_8_ = local_1c0;
        auVar9._8_8_ = uStack_1b8;
        auVar9._0_8_ = local_1c0;
        _local_1a0 = vunpckhpd_avx(auVar9,auVar5);
        local_200 = local_1f0 + (float)local_1a0._0_4_;
        fStack_1fc = fStack_1ec + (float)local_1a0._4_4_;
        fStack_1f8 = fStack_1e8 + fStack_198;
        fStack_1f4 = fStack_1e4 + fStack_194;
        local_130._0_4_ = local_200 + fStack_1fc;
        auVar9 = ZEXT416((uint)local_130._0_4_);
        local_130._4_4_ = 0;
        local_210 = local_130._0_8_;
        uStack_208 = 0;
        local_120 = local_130._0_8_;
        uStack_118 = 0;
        fVar10 = local_644 + (float)local_130._0_4_;
        local_438 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_430 = stride_h;
        local_4e0 = local_538;
        local_42c[0] = fVar10;
        local_1b0 = local_1c0;
        uStack_1a8 = uStack_1b8;
        local_190 = local_1c0;
        uStack_188 = uStack_1b8;
        local_180 = uVar1;
        uStack_178 = uVar2;
        local_170 = uVar3;
        uStack_168 = uVar4;
        local_140 = fStack_1fc;
        fStack_13c = fStack_1fc;
        fStack_138 = fStack_1fc;
        fStack_134 = fStack_1fc;
        local_130 = auVar9;
        local_6b0 = local_108;
        local_644 = fVar10;
        switch(stride_h) {
        case 1:
          dVar8 = std::fmax((double)(ulong)(uint)fVar10,0.0);
          local_42c[0] = SUB84(dVar8,0);
          break;
        case 2:
          local_3e8 = 0;
          local_43c = *(float *)*local_438;
          local_3e0 = local_438;
          if (fVar10 <= 0.0) {
            local_42c[0] = fVar10 * local_43c;
          }
          break;
        case 3:
          local_3f8 = 0;
          local_440 = *(float *)*local_438;
          local_408 = 1;
          local_444 = *(float *)(*local_438 + 4);
          if (fVar10 < local_440) {
            local_42c[0] = local_440;
          }
          local_400 = local_438;
          local_3f0 = local_438;
          if (local_444 < local_42c[0]) {
            local_42c[0] = local_444;
          }
          break;
        case 4:
          local_448 = 88.37626;
          pfVar7 = std::min<float>(local_42c,&local_448);
          local_42c[0] = *pfVar7;
          local_44c = -88.37626;
          pfVar7 = std::max<float>(local_42c,&local_44c);
          local_42c[0] = *pfVar7;
          dVar8 = std::exp((double)(ulong)(uint)-local_42c[0]);
          local_42c[0] = 1.0 / (SUB84(dVar8,0) + 1.0);
          break;
        case 5:
          dVar8 = std::exp((double)(ulong)(uint)fVar10);
          dVar8 = std::log((double)(ulong)(uint)(SUB84(dVar8,0) + 1.0));
          dVar8 = std::tanh(dVar8);
          local_42c[0] = fVar10 * SUB84(dVar8,0);
          break;
        case 6:
          local_418 = 0;
          local_450 = *(float *)*local_438;
          local_42c[1] = 1.4013e-45;
          local_42c[2] = 0.0;
          local_454 = *(float *)(*local_438 + 4);
          local_458 = -local_454 / local_450;
          local_45c = 1.0 / local_450 + local_458;
          local_420 = local_438;
          local_410 = local_438;
          if (local_458 <= fVar10) {
            if (fVar10 <= local_45c) {
              local_42c[0] = fVar10 * (fVar10 * local_450 + local_454);
            }
          }
          else {
            local_42c[0] = 0.0;
          }
        }
        local_644 = local_42c[0];
        *(float *)(local_5f0 + (long)local_640 * 4) = local_42c[0];
        in_stack_fffffffffffff79c = local_42c[0];
      }
      local_5f0 = local_5f0 + (long)local_57c * 4;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  return;
}

Assistant:

static void convolution_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m256 _sum = _mm256_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m256 _val = _mm256_load_ps(sptr + space_ofs[k] * 8);
                        __m256 _w = _mm256_load_ps(kptr);
                        _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                        kptr += 8;
                    }
                }

                sum += _mm256_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}